

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O3

int ptls_load_pem_objects
              (char *pem_fname,char *label,ptls_iovec_t *list,size_t list_max,size_t *nb_objects)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  char line [256];
  ptls_buffer_t local_178;
  ptls_base64_decode_state_t local_158;
  ptls_iovec_t *local_148;
  size_t local_140;
  char local_138 [264];
  
  __stream = fopen(pem_fname,"r");
  iVar1 = 0;
  *nb_objects = 0;
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
    bVar5 = false;
    goto LAB_00108381;
  }
  if (list_max == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    local_148 = list;
    local_140 = list_max;
    do {
      local_178.base = "";
      local_178.capacity = 0;
      local_178.off = 0;
      local_178.is_allocated = 0;
      do {
        pcVar3 = fgets(local_138,0x100,__stream);
        if (pcVar3 == (char *)0x0) {
          iVar1 = 0x233;
          goto LAB_0010835e;
        }
        iVar1 = ptls_compare_separator_line(local_138,"BEGIN",label);
      } while (iVar1 != 0);
      local_158.nbc = 0;
      local_158.nbo = 3;
      local_158.status = 1;
      local_158.v = 0;
      while (pcVar3 = fgets(local_138,0x100,__stream), pcVar3 != (char *)0x0) {
        iVar1 = ptls_compare_separator_line(local_138,"END",label);
        if (iVar1 == 0) {
          if ((local_158.status != 0) &&
             ((iVar1 = 0x232, local_158.status != 1 || (local_158.nbc != 0)))) goto LAB_0010835e;
          break;
        }
        iVar1 = ptls_base64_decode(local_138,&local_158,&local_178);
        if (iVar1 != 0) goto LAB_0010835e;
      }
      if ((local_178.off == 0) || (local_178.is_allocated == 0)) {
        ptls_buffer__release_memory(&local_178);
      }
      else {
        local_148[uVar4].base = local_178.base;
        local_148[uVar4].len = local_178.off;
        uVar4 = uVar4 + 1;
      }
      iVar1 = 0;
    } while (uVar4 < local_140);
  }
  goto LAB_0010836d;
LAB_0010835e:
  ptls_buffer__release_memory(&local_178);
LAB_0010836d:
  *nb_objects = uVar4;
  fclose(__stream);
  bVar5 = uVar4 != 0;
LAB_00108381:
  iVar2 = 0;
  if (iVar1 != 0x233) {
    iVar2 = iVar1;
  }
  if (!bVar5) {
    iVar2 = iVar1;
  }
  return iVar2;
}

Assistant:

int ptls_load_pem_objects(char const *pem_fname, const char *label, ptls_iovec_t *list, size_t list_max, size_t *nb_objects)
{
    FILE *F;
    int ret = 0;
    size_t count = 0;
#ifdef _WINDOWS
    errno_t err = fopen_s(&F, pem_fname, "r");
    if (err != 0) {
        ret = -1;
    }
#else
    F = fopen(pem_fname, "r");
    if (F == NULL) {
        ret = -1;
    }
#endif

    *nb_objects = 0;

    if (ret == 0) {
        while (count < list_max) {
            ptls_buffer_t buf;

            ptls_buffer_init(&buf, "", 0);

            ret = ptls_get_pem_object(F, label, &buf);

            if (ret == 0) {
                if (buf.off > 0 && buf.is_allocated) {
                    list[count].base = buf.base;
                    list[count].len = buf.off;
                    count++;
                } else {
                    ptls_buffer_dispose(&buf);
                }
            } else {
                ptls_buffer_dispose(&buf);
                break;
            }
        }
    }

    if (ret == PTLS_ERROR_PEM_LABEL_NOT_FOUND && count > 0) {
        ret = 0;
    }

    *nb_objects = count;

    if (F != NULL) {
        fclose(F);
    }

    return ret;
}